

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_double_&,_const_int_&> * __thiscall
Catch::ExprLhs<double_const&>::operator==
          (BinaryExpr<const_double_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<double_const&> *this,int *rhs)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  StringRef local_38;
  
  iVar2 = *rhs;
  pdVar3 = *(double **)this;
  dVar1 = *pdVar3;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = (double)iVar2 == dVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00570418;
  __return_storage_ptr__->m_lhs = pdVar3;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }